

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ContinuousAssignSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ContinuousAssignSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  ContinuousAssignSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (ContinuousAssignSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    token.kind = (this->assign).kind;
    token._2_1_ = (this->assign).field_0x2;
    token.numFlags.raw = (this->assign).numFlags.raw;
    token.rawLen = (this->assign).rawLen;
    token.info = (this->assign).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)this->strength);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->delay->super_SyntaxNode);
    break;
  case 4:
    local_70 = (SyntaxNode *)0x0;
    if (this != (ContinuousAssignSyntax *)0xffffffffffffffa0) {
      local_70 = &(this->assignments).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 5:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ContinuousAssignSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return assign;
        case 2: return strength;
        case 3: return delay;
        case 4: return &assignments;
        case 5: return semi;
        default: return nullptr;
    }
}